

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2badaf::check<float>(istream *is,float c)

{
  ostream *poVar1;
  uchar b [4];
  
  std::istream::read((char *)is,(long)b);
  poVar1 = std::operator<<((ostream *)&std::cout,_fread + (*_fread == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)b);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (((float)b == c) && (!NAN((float)b) && !NAN(c))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = float]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}